

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O3

void __thiscall ipx::KKTSolverBasis::DropDual(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  ipxint *piVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  double *pdVar5;
  bool bVar6;
  Int IVar7;
  void *__s;
  ostream *poVar8;
  long lVar9;
  Info *pIVar10;
  uint uVar11;
  ulong uVar12;
  fmtflags floatfield;
  string *in_R8;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<int,_std::allocator<int>_> candidates;
  bool exchanged;
  IndexedVector ftran;
  int *local_d8;
  iterator iStack_d0;
  int *local_c8;
  Iterate *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  string local_a0;
  Info *local_80;
  IndexedVector local_78;
  double local_48;
  undefined8 uStack_40;
  
  IVar7 = this->model_->num_rows_;
  iVar2 = this->model_->num_cols_;
  local_c0 = iterate;
  IndexedVector::IndexedVector(&local_78,IVar7);
  local_b8 = (this->control_->parameters_).super_ipx_parameters.ipm_drop_dual;
  (info->super_ipx_info).errflag = 0;
  local_d8 = (int *)0x0;
  iStack_d0._M_current = (int *)0x0;
  local_c8 = (int *)0x0;
  local_a0._M_dataplus._M_p._0_4_ = 0;
  iVar13 = iVar2 + IVar7;
  if (iVar13 != 0 && SCARRY4(iVar2,IVar7) == iVar13 < 0) {
    local_80 = info;
    do {
      lVar9 = (long)(int)local_a0._M_dataplus._M_p;
      if ((this->basis_->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] == -1) {
        dVar15 = (local_c0->zl_)._M_data[lVar9];
        dVar16 = (local_c0->zu_)._M_data[lVar9];
        dVar14 = dVar16;
        if (dVar15 >= dVar16) {
          dVar14 = dVar15;
        }
        if ((dVar14 < (&local_c0->xl_)[dVar15 < dVar16]._M_data[lVar9] * 0.01) &&
           (dVar14 <= local_b8)) {
          if (iStack_d0._M_current == local_c8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,(int *)&local_a0);
          }
          else {
            *iStack_d0._M_current = (int)local_a0._M_dataplus._M_p;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
      }
      local_a0._M_dataplus._M_p._0_4_ = (int)local_a0._M_dataplus._M_p + 1;
    } while ((int)local_a0._M_dataplus._M_p < iVar13);
    if (local_d8 != iStack_d0._M_current) {
      uVar12 = (long)IVar7 * 8;
      __s = operator_new(uVar12);
      memset(__s,0,uVar12);
      if (0 < IVar7) {
        piVar4 = (this->basis_->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->colscale_)._M_data;
        lVar9 = 0;
        do {
          *(double *)((long)__s + lVar9 * 8) = 1.0 / pdVar5[piVar4[lVar9]];
          lVar9 = lVar9 + 1;
        } while (IVar7 != lVar9);
      }
      pIVar10 = local_80;
      if (local_d8 != iStack_d0._M_current) {
        do {
          iVar2 = iStack_d0._M_current[-1];
          local_b8 = (this->colscale_)._M_data[iVar2];
          Basis::SolveForUpdate(this->basis_,iVar2,&local_78);
          bVar6 = IndexedVector::sparse(&local_78);
          if (bVar6) {
            if ((long)local_78.nnz_ < 1) goto LAB_0039fff9;
            uVar11 = 0xffffffff;
            dVar15 = 2.0;
            lVar9 = 0;
            do {
              uVar3 = local_78.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9];
              in_R8 = (string *)(ulong)uVar3;
              if ((1e-07 < ABS(local_78.elements_._M_data[(int)uVar3])) &&
                 (dVar16 = ABS(local_78.elements_._M_data[(int)uVar3]) *
                           *(double *)((long)__s + (long)(int)uVar3 * 8) * local_b8, dVar15 < dVar16
                 )) {
                dVar15 = dVar16;
                uVar11 = uVar3;
              }
              lVar9 = lVar9 + 1;
            } while (local_78.nnz_ != lVar9);
LAB_0039fed8:
            floatfield = (fmtflags)in_R8;
            if ((int)uVar11 < 0) goto LAB_0039fff9;
            uVar12 = (ulong)uVar11;
            local_b8 = local_78.elements_._M_data[uVar12];
            uStack_b0 = 0;
            local_48 = ABS(local_b8);
            uStack_40 = 0;
            if (local_48 < 0.001) {
              poVar8 = Control::Debug(this->control_,3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," |pivot| = ",0xb);
              Format_abi_cxx11_(&local_a0,(ipx *)0x0,local_48,2,0x100,floatfield);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                                          (int)local_a0._M_dataplus._M_p),
                                  local_a0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," (dual nonbasic variable close to zero)\n",0x28);
              pIVar10 = local_80;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p) !=
                  &local_a0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                         (int)local_a0._M_dataplus._M_p));
              }
            }
            in_R8 = &local_a0;
            IVar7 = Basis::ExchangeIfStable
                              (this->basis_,
                               (this->basis_->basis_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar12],iVar2,local_b8,-1,
                               (bool *)in_R8);
            (pIVar10->super_ipx_info).errflag = IVar7;
            if (IVar7 != 0) break;
            if ((char)local_a0._M_dataplus._M_p == '\x01') {
              *(double *)((long)__s + uVar12 * 8) = 1.0 / (this->colscale_)._M_data[iVar2];
              piVar1 = &(pIVar10->super_ipx_info).updates_ipm;
              *piVar1 = *piVar1 + 1;
              this->basis_changes_ = this->basis_changes_ + 1;
              goto LAB_003a0024;
            }
          }
          else {
            if (0 < (int)(uint)local_78.elements_._M_size) {
              uVar11 = 0xffffffff;
              dVar15 = 2.0;
              uVar12 = 0;
              do {
                if ((1e-07 < ABS(local_78.elements_._M_data[uVar12])) &&
                   (dVar16 = ABS(local_78.elements_._M_data[uVar12]) *
                             *(double *)((long)__s + uVar12 * 8) * local_b8, dVar15 < dVar16)) {
                  uVar11 = (uint)uVar12;
                  dVar15 = dVar16;
                }
                uVar12 = uVar12 + 1;
              } while (((uint)local_78.elements_._M_size & 0x7fffffff) != uVar12);
              goto LAB_0039fed8;
            }
LAB_0039fff9:
            Iterate::make_fixed(local_c0,iVar2);
            Basis::FixNonbasicVariable(this->basis_,iVar2);
            (this->colscale_)._M_data[iVar2] = 0.0;
            piVar1 = &(pIVar10->super_ipx_info).dual_dropped;
            *piVar1 = *piVar1 + 1;
LAB_003a0024:
            iStack_d0._M_current = iStack_d0._M_current + -1;
          }
        } while (local_d8 != iStack_d0._M_current);
      }
      operator_delete(__s);
    }
    if (local_d8 != (int *)0x0) {
      operator_delete(local_d8);
    }
  }
  if (local_78.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_78.elements_._M_data);
  return;
}

Assistant:

void KKTSolverBasis::DropDual(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& xl = iterate->xl();
    const Vector& xu = iterate->xu();
    const Vector& zl = iterate->zl();
    const Vector& zu = iterate->zu();
    IndexedVector ftran(m);
    const double drop_dual = control_.ipm_drop_dual();
    const double volume_tol = 2.0;
    info->errflag = 0;

    std::vector<Int> candidates;
    for (Int jn = 0; jn < n+m; jn++) {
        if (basis_.StatusOf(jn) != Basis::NONBASIC)
            continue;
        assert(std::isfinite(xl[jn]) || std::isfinite(xu[jn]));
        assert(xl[jn] > 0.0);
        assert(xu[jn] > 0.0);
        assert(zl[jn] > 0.0 || zu[jn] > 0.0);
        double xj, zj;
        if (zl[jn] >= zu[jn]) { // choose larger dual variable
            xj = xl[jn];
            zj = zl[jn];
        } else {
            xj = xu[jn];
            zj = zu[jn];
        }
        if (zj < 0.01*xj && zj <= drop_dual)
            candidates.push_back(jn);
    }
    if (candidates.empty())
        return;

    // Maintain a copy of the inverse scaling factors of basic variables for
    // faster access.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis_[p];
        invscale_basic[p] = 1.0 / colscale_[j];
        assert(std::isfinite(invscale_basic[p]));
        assert(invscale_basic[p] >= 0.0);
    }

    while (!candidates.empty()) {
        Int jn = candidates.back();
        // Pivot jn into the basis if volume increases sufficiently.
        const double s = colscale_[jn];
        basis_.SolveForUpdate(jn, ftran);
        Int pmax = -1;
        double vmax = volume_tol;
        auto search_pivot = [&](Int p, double pivot) {
            pivot = std::abs(pivot);
            if (pivot > kPivotZeroTol) {
                double v = pivot * invscale_basic[p] * s;
                if (v > vmax) {
                    vmax = v;
                    pmax = p;
                }
            }
        };
        for_each_nonzero(ftran, search_pivot);
        if (pmax >= 0) {
            double pivot = ftran[pmax];
            if (std::abs(pivot) < 1e-3)
                control_.Debug(3)
                    << " |pivot| = " << sci2(std::abs(pivot))
                    << " (dual nonbasic variable close to zero)\n";
            Int jb = basis_[pmax];
            // Pivot jn into the basis.
            assert(basis_.StatusOf(jb) == Basis::BASIC);
            bool exchanged;
            info->errflag = basis_.ExchangeIfStable(jb, jn, pivot, -1,
                                                    &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[pmax] = 1.0 / colscale_[jn];
            assert(std::isfinite(invscale_basic[pmax]));
            assert(invscale_basic[pmax] >= 0.0);
            info->updates_ipm++;
            basis_changes_++;
        } else {
            // Make variable jn "fixed" at its current value.
            iterate->make_fixed(jn);
            basis_.FixNonbasicVariable(jn);
            colscale_[jn] = 0.0;
            info->dual_dropped++;
        }
        candidates.pop_back();
    }
}